

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger.cpp
# Opt level: O3

bool __thiscall
LoaderLogger::LogMessage
          (LoaderLogger *this,XrLoaderLogMessageSeverityFlagBits message_severity,
          XrLoaderLogMessageTypeFlags message_type,string *message_id,string *command_name,
          string *message,vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *objects)

{
  pointer puVar1;
  LoaderLogRecorder *pLVar2;
  void *pvVar3;
  int iVar4;
  byte bVar5;
  unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *recorder;
  pointer puVar6;
  NamesAndLabels names_and_labels;
  NamesAndLabels local_c8;
  pointer local_80;
  pointer local_78;
  pointer local_70;
  undefined8 local_68;
  pointer pXStack_60;
  undefined8 local_58;
  pointer local_50;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_48;
  
  local_68 = 0;
  pXStack_60 = (pointer)0x0;
  local_58 = 0;
  local_80 = (message_id->_M_dataplus)._M_p;
  local_78 = (command_name->_M_dataplus)._M_p;
  local_70 = (message->_M_dataplus)._M_p;
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(&local_48,objects);
  DebugUtilsData::PopulateNamesAndLabels(&local_c8,&this->data_,&local_48);
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_48);
  pXStack_60 = local_c8.sdk_objects.
               super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
  if (local_c8.sdk_objects.
      super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_c8.sdk_objects.
      super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pXStack_60 = (pointer)0x0;
  }
  local_68 = CONCAT71(local_68._1_7_,
                      (char)((uint)((int)local_c8.objects.
                                         super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (int)local_c8.objects.
                                        super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33);
  local_50 = (pointer)0x0;
  if (local_c8.labels.
      super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_c8.labels.
      super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_50 = (pointer)local_c8.labels.
                        super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>
                        ._M_impl.super__Vector_impl_data._M_start;
  }
  local_58 = CONCAT71(local_58._1_7_,
                      (char)((uint)((int)local_c8.labels.
                                         super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (int)local_c8.labels.
                                        super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55);
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  puVar6 = (this->_recorders).
           super__Vector_base<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->_recorders).
           super__Vector_base<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = 0;
  if (puVar6 != puVar1) {
    do {
      pLVar2 = (puVar6->_M_t).
               super___uniq_ptr_impl<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>.
               _M_t.
               super__Tuple_impl<0UL,_LoaderLogRecorder_*,_std::default_delete<LoaderLogRecorder>_>.
               super__Head_base<0UL,_LoaderLogRecorder_*,_false>._M_head_impl;
      if (((message_severity & ~pLVar2->_message_severities) == 0) &&
         ((message_type & ~pLVar2->_message_types) == 0)) {
        iVar4 = (*pLVar2->_vptr_LoaderLogRecorder[6])
                          (pLVar2,message_severity,message_type,&local_80);
        bVar5 = bVar5 | (byte)iVar4;
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar1);
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)this);
  if ((pointer)local_c8.labels.
               super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>.
               _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.labels.
                    super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.labels.
                          super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.labels.
                          super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar3 = (void *)CONCAT44(local_c8.objects.
                            super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            (int)local_c8.objects.
                                 super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,(long)local_c8.objects.
                                 super__Vector_base<XrDebugUtilsObjectNameInfoEXT,_std::allocator<XrDebugUtilsObjectNameInfoEXT>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar3);
  }
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
            (&local_c8.sdk_objects);
  return (bool)(bVar5 & 1);
}

Assistant:

bool LoaderLogger::LogMessage(XrLoaderLogMessageSeverityFlagBits message_severity, XrLoaderLogMessageTypeFlags message_type,
                              const std::string& message_id, const std::string& command_name, const std::string& message,
                              const std::vector<XrSdkLogObjectInfo>& objects) {
    XrLoaderLogMessengerCallbackData callback_data = {};
    callback_data.message_id = message_id.c_str();
    callback_data.command_name = command_name.c_str();
    callback_data.message = message.c_str();

    auto names_and_labels = data_.PopulateNamesAndLabels(objects);
    callback_data.objects = names_and_labels.sdk_objects.empty() ? nullptr : names_and_labels.sdk_objects.data();
    callback_data.object_count = static_cast<uint8_t>(names_and_labels.objects.size());

    callback_data.session_labels = names_and_labels.labels.empty() ? nullptr : names_and_labels.labels.data();
    callback_data.session_labels_count = static_cast<uint8_t>(names_and_labels.labels.size());

    std::shared_lock<std::shared_timed_mutex> lock(_mutex);
    bool exit_app = false;
    for (std::unique_ptr<LoaderLogRecorder>& recorder : _recorders) {
        if ((recorder->MessageSeverities() & message_severity) == message_severity &&
            (recorder->MessageTypes() & message_type) == message_type) {
            exit_app |= recorder->LogMessage(message_severity, message_type, &callback_data);
        }
    }
    return exit_app;
}